

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryPolynomialModel<int,_double>::BinaryPolynomialModel
          (BinaryPolynomialModel<int,_double> *this,vector<int,_std::allocator<int>_> *variables,
          PolynomialKeyList<std::size_t> *poly_key_distance_list,
          PolynomialValueList<double> *poly_value_list,Vartype vartype)

{
  pointer pvVar1;
  pointer puVar2;
  pointer pvVar3;
  key_type *pkVar4;
  BinaryPolynomialModel<int,_double> *pBVar5;
  PolynomialKeyList<int> *pPVar6;
  __buckets_ptr pp_Var7;
  size_type sVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  runtime_error *this_00;
  int *__args;
  unsigned_long *it;
  pointer puVar12;
  key_type *__k;
  size_type sVar13;
  mapped_type mVar14;
  long lVar15;
  mapped_type mVar16;
  vector<int,_std::allocator<int>_> temp;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  BinaryPolynomialModel<int,_double> *local_c0;
  PolynomialKeyList<int> *local_b8;
  PolynomialValueList<double> *local_b0;
  size_type local_a8;
  _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a0;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_98;
  pointer local_58;
  pointer local_50;
  size_type local_48;
  PolynomialValueList<double> *local_40;
  PolynomialKeyList<std::size_t> *local_38;
  
  (this->variables_)._M_h._M_buckets = &(this->variables_)._M_h._M_single_bucket;
  (this->variables_)._M_h._M_bucket_count = 1;
  (this->variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_)._M_h._M_element_count = 0;
  (this->variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->each_variable_num_)._M_h._M_buckets = &(this->each_variable_num_)._M_h._M_single_bucket;
  (this->each_variable_num_)._M_h._M_bucket_count = 1;
  (this->each_variable_num_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->each_variable_num_)._M_h._M_element_count = 0;
  (this->each_variable_num_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->each_variable_num_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->each_variable_num_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->variables_to_integers_)._M_h._M_buckets =
       &(this->variables_to_integers_)._M_h._M_single_bucket;
  (this->variables_to_integers_)._M_h._M_bucket_count = 1;
  (this->variables_to_integers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_to_integers_)._M_h._M_element_count = 0;
  (this->variables_to_integers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_to_integers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_to_integers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->relabel_flag_for_variables_to_integers_ = true;
  local_b8 = &this->poly_key_list_;
  local_b0 = &this->poly_value_list_;
  local_a0 = (_Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->poly_key_inv_;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poly_key_inv_)._M_h._M_buckets = &(this->poly_key_inv_)._M_h._M_single_bucket;
  (this->poly_key_inv_)._M_h._M_bucket_count = 1;
  (this->poly_key_inv_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->poly_key_inv_)._M_h._M_element_count = 0;
  (this->poly_key_inv_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->poly_key_inv_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->poly_key_inv_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->vartype_ = vartype;
  local_c0 = this;
  if (vartype == NONE) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown vartype detected");
  }
  else if (((long)(poly_key_distance_list->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(poly_key_distance_list->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
           ((long)(poly_value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(poly_value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3) == 0) {
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_98,
               (variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,0,&local_c1,&local_c2,&local_c3);
    pBVar5 = local_c0;
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_move_assign((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)local_c0,&local_98);
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_98);
    if ((pBVar5->variables_)._M_h._M_element_count ==
        (long)(variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2) {
      local_50 = (poly_key_distance_list->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_58 = (poly_key_distance_list->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      lVar15 = (long)local_58 - (long)local_50;
      sVar13 = (lVar15 >> 3) * -0x5555555555555555;
      local_40 = poly_value_list;
      local_38 = poly_key_distance_list;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(local_b8,sVar13);
      std::vector<double,_std::allocator<double>_>::resize(local_b0,sVar13);
      local_a8 = sVar13;
      if (0 < lVar15) {
        local_48 = 1;
        if (1 < (long)sVar13) {
          local_48 = sVar13;
        }
        sVar13 = 0;
        do {
          local_98._M_buckets = (__buckets_ptr)0x0;
          local_98._M_bucket_count = 0;
          local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          pvVar1 = (local_38->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar2 = *(pointer *)
                    ((long)&pvVar1[sVar13].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8);
          for (puVar12 = pvVar1[sVar13].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; sVar8 = local_98._M_bucket_count,
              pp_Var7 = local_98._M_buckets, puVar12 != puVar2; puVar12 = puVar12 + 1) {
            __args = (variables->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + *puVar12;
            if ((_Hash_node_base *)local_98._M_bucket_count == local_98._M_before_begin._M_nxt) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_98,
                         (iterator)local_98._M_bucket_count,__args);
            }
            else {
              *(int *)local_98._M_bucket_count = *__args;
              local_98._M_bucket_count = local_98._M_bucket_count + 4;
            }
          }
          if (local_98._M_buckets != (__buckets_ptr)local_98._M_bucket_count) {
            uVar9 = (long)(local_98._M_bucket_count - (long)local_98._M_buckets) >> 2;
            lVar15 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_98._M_buckets,local_98._M_bucket_count,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e
                      );
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (pp_Var7,sVar8);
          }
          std::vector<int,_std::allocator<int>_>::operator=
                    ((local_b8->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + sVar13,
                     (vector<int,_std::allocator<int>_> *)&local_98);
          (local_b0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar13] =
               (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[sVar13];
          if (local_98._M_buckets != (__buckets_ptr)0x0) {
            operator_delete(local_98._M_buckets,
                            (long)local_98._M_before_begin._M_nxt - (long)local_98._M_buckets);
          }
          sVar13 = sVar13 + 1;
        } while (sVar13 != local_48);
      }
      if (local_58 != local_50) {
        mVar14 = local_a8 + (local_a8 == 0);
        mVar16 = 0;
        do {
          pPVar6 = local_b8;
          pmVar10 = std::__detail::
                    _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_a0,(local_b8->
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + mVar16);
          *pmVar10 = mVar16;
          pvVar3 = (pPVar6->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pkVar4 = *(pointer *)
                    ((long)&pvVar3[mVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          for (__k = pvVar3[mVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; __k != pkVar4; __k = __k + 1) {
            pmVar11 = std::__detail::
                      _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&this->each_variable_num_,__k);
            *pmVar11 = *pmVar11 + 1;
          }
          mVar16 = mVar16 + 1;
        } while (mVar16 != mVar14);
      }
      UpdateVariablesToIntegers(local_c0);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Unknown error. It seems that the input variables contain the same variables"
              );
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"The sizes of key_list and value_list must match each other");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryPolynomialModel(
        const std::vector<IndexType> &variables,
        const PolynomialKeyList<std::size_t> &poly_key_distance_list,
        const PolynomialValueList<FloatType> &poly_value_list,
        const Vartype vartype ) :
        vartype_( vartype ) {
      if ( vartype_ == Vartype::NONE ) {
        throw std::runtime_error( "Unknown vartype detected" );
      }

      if ( poly_key_distance_list.size() != poly_value_list.size() ) {
        throw std::runtime_error( "The sizes of key_list and value_list must match each other" );
      }

      variables_ = std::unordered_set<IndexType>( variables.begin(), variables.end() );

      if ( variables_.size() != variables.size() ) {
        throw std::runtime_error( "Unknown error. It seems that the input variables contain the same variables" );
      }

      std::size_t num_interactions = poly_key_distance_list.size();
      poly_key_list_.resize( num_interactions );
      poly_value_list_.resize( num_interactions );

#pragma omp parallel for
      for ( int64_t i = 0; i < ( int64_t )num_interactions; ++i ) {
        std::vector<IndexType> temp;
        for ( const auto &it : poly_key_distance_list[ i ] ) {
          temp.push_back( variables[ it ] );
        }
        std::sort( temp.begin(), temp.end() );
        poly_key_list_[ i ] = temp;
        poly_value_list_[ i ] = poly_value_list[ i ];
      }

      for ( std::size_t i = 0; i < num_interactions; ++i ) {
        poly_key_inv_[ poly_key_list_[ i ] ] = i;
        for ( const auto &it : poly_key_list_[ i ] ) {
          each_variable_num_[ it ]++;
        }
      }

      UpdateVariablesToIntegers();
    }